

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckRules.cpp
# Opt level: O2

void __thiscall GdlGlyphClassDefn::MarkFsmClass(GdlGlyphClassDefn *this,int nPassID,int nClassID)

{
  uint uVar1;
  reference rVar2;
  value_type_conflict2 local_2c;
  
  uVar1 = nPassID + 1;
  if ((ulong)(this->m_vfFsm).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
      ((long)(this->m_vfFsm).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
      (long)(this->m_vfFsm).super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 < (ulong)uVar1) {
    std::vector<bool,_std::allocator<bool>_>::resize(&this->m_vfFsm,(long)(int)uVar1,false);
    local_2c = -1;
    std::vector<int,_std::allocator<int>_>::resize(&this->m_vnFsmID,(long)(int)uVar1,&local_2c);
  }
  rVar2 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->m_vfFsm,(long)nPassID);
  *rVar2._M_p = *rVar2._M_p | rVar2._M_mask;
  (this->m_vnFsmID).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start[nPassID] = nClassID;
  return;
}

Assistant:

void GdlGlyphClassDefn::MarkFsmClass(int nPassID, int nClassID)
{
	if (m_vfFsm.size() >= unsigned(nPassID + 1))
	{
		// Once it's set it shouldn't be changed.
		Assert(!m_vfFsm[nPassID] || m_vnFsmID[nPassID] == nClassID);
	}
	else
	{
		m_vfFsm.resize(nPassID + 1, false);
		m_vnFsmID.resize(nPassID + 1, -1);
	}

	m_vfFsm[nPassID] = true;
	m_vnFsmID[nPassID] = nClassID;
}